

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dec_api.c
# Opt level: O1

MPP_RET dummy_dec_deinit(void *dec)

{
  MPP_RET MVar1;
  
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"dummy_dec_api","found NULL intput\n","dummy_dec_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (*(long *)((long)dec + 0x28) != 0) {
      mpp_packet_deinit((MppPacket *)((long)dec + 0x28));
    }
    MVar1 = MPP_OK;
    if (*(void **)((long)dec + 0x18) != (void *)0x0) {
      mpp_osal_free("dummy_dec_deinit",*(void **)((long)dec + 0x18));
      MVar1 = MPP_OK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET dummy_dec_deinit(void *dec)
{
    DummyDec *p;
    if (NULL == dec) {
        mpp_err_f("found NULL intput\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (DummyDec *)dec;
    if (p->task_pkt)
        mpp_packet_deinit(&p->task_pkt);
    if (p->stream)
        mpp_free(p->stream);
    return MPP_OK;
}